

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O0

void dma_heap_deinit(void)

{
  ulong uVar1;
  DmaHeapInfo *info;
  RK_U32 i;
  
  for (info._4_4_ = 0; info._4_4_ < 8; info._4_4_ = info._4_4_ + 1) {
    uVar1 = (ulong)info._4_4_;
    if (0 < heap_infos[uVar1].fd) {
      close(heap_infos[uVar1].fd);
      heap_infos[uVar1].fd = -1;
    }
  }
  return;
}

Assistant:

__attribute__ ((destructor))
void dma_heap_deinit(void)
{
    RK_U32 i;

    for (i = 0; i < MPP_ARRAY_ELEMS(heap_infos); i++) {
        DmaHeapInfo *info = &heap_infos[i];

        if (info->fd > 0) {
            close(info->fd);
            info->fd = -1;
        }
    }
}